

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O1

int write_rr_ER(archive_write *a)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  
  pvVar1 = a->format_data;
  lVar2 = *(long *)((long)pvVar1 + 0x102e0);
  memset((void *)((long)pvVar1 + (0x102dc - lVar2)),0,0x800);
  *(undefined8 *)((long)pvVar1 + (0x102dc - lVar2)) = 0x187540a01ed5245;
  *(undefined8 *)((long)pvVar1 + (0x102e4 - lVar2)) = 0x3939315f50495252;
  *(undefined2 *)((long)pvVar1 + (0x102ec - lVar2)) = 0x4131;
  memcpy((void *)((long)pvVar1 + (0x102ee - lVar2)),
         "THE ROCK RIDGE INTERCHANGE PROTOCOL PROVIDES SUPPORT FOR POSIX FILE SYSTEM SEMANTICS",0x54
        );
  memcpy((void *)((long)pvVar1 + (0x10342 - lVar2)),
         "PLEASE CONTACT DISC PUBLISHER FOR SPECIFICATION SOURCE.  SEE PUBLISHER IDENTIFIER IN PRIMARY VOLUME DESCRIPTOR FOR CONTACT INFORMATION."
         ,0x87);
  iVar3 = wb_consume(a,0x800);
  return iVar3;
}

Assistant:

static int
write_rr_ER(struct archive_write *a)
{
	unsigned char *p;

	p = wb_buffptr(a);

	memset(p, 0, LOGICAL_BLOCK_SIZE);
	p[0] = 'E';
	p[1] = 'R';
	p[3] = 0x01;
	p[2] = RRIP_ER_SIZE;
	p[4] = RRIP_ER_ID_SIZE;
	p[5] = RRIP_ER_DSC_SIZE;
	p[6] = RRIP_ER_SRC_SIZE;
	p[7] = 0x01;
	memcpy(&p[8], rrip_identifier, p[4]);
	memcpy(&p[8+p[4]], rrip_descriptor, p[5]);
	memcpy(&p[8+p[4]+p[5]], rrip_source, p[6]);

	return (wb_consume(a, LOGICAL_BLOCK_SIZE));
}